

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fLifetimeTests.cpp
# Opt level: O1

void deqp::gles3::Functional::anon_unknown_0::initBuffer
               (Functions *gl,GLuint seed,GLenum usage,GLuint buffer)

{
  GLenum err;
  undefined1 *puVar1;
  long lVar2;
  float fVar3;
  GLfloat data [12];
  Random rnd;
  float afStack_74 [2];
  undefined8 uStack_6c;
  float fStack_64;
  undefined8 auStack_60 [5];
  deRandom local_38;
  
  puVar1 = (undefined1 *)((long)&uStack_6c + 4);
  stack0xffffffffffffff90 = 0x1080d4b;
  (*gl->bindBuffer)(0x8892,buffer);
  if (seed == 0) {
    puVar1 = Functional::(anonymous_namespace)::s_varrData;
  }
  else {
    stack0xffffffffffffff90 = 0x1080d60;
    deRandom_init(&local_38,seed);
    lVar2 = 0xc;
    do {
      stack0xffffffffffffff90 = 0x1080d78;
      fVar3 = deRandom_getFloat(&local_38);
      *(float *)((long)afStack_74 + lVar2) = fVar3 + -0.5 + fVar3 + -0.5;
      stack0xffffffffffffff90 = 0x1080d97;
      fVar3 = deRandom_getFloat(&local_38);
      *(float *)((long)afStack_74 + lVar2 + 4) = fVar3 + -0.5 + fVar3 + -0.5;
      *(undefined8 *)((long)&uStack_6c + lVar2) = 0x3f80000000000000;
      lVar2 = lVar2 + 0x10;
    } while (lVar2 != 0x3c);
  }
  stack0xffffffffffffff90 = 0x1080dd7;
  (*gl->bufferData)(0x8892,0x30,puVar1,usage);
  stack0xffffffffffffff90 = 0x1080de1;
  (*gl->bindBuffer)(0x8892,0);
  stack0xffffffffffffff90 = 0x1080de7;
  err = (*gl->getError)();
  stack0xffffffffffffff90 = 0x1080dfc;
  glu::checkError(err,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
                  ,0xfe);
  return;
}

Assistant:

void initBuffer (const Functions& gl, GLuint seed, GLenum usage, GLuint buffer)
{
	gl.bindBuffer(GL_ARRAY_BUFFER, buffer);
	if (seed == 0)
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(s_varrData), s_varrData, usage);
	else
	{
		Random	rnd	(seed);
		GLfloat data[DE_LENGTH_OF_ARRAY(s_varrData)];

		for (int ndx = 0; ndx < NUM_VERTICES; ndx++)
		{
			GLfloat* vertex = &data[ndx * NUM_COMPONENTS];
			vertex[0] = 2.0f * (rnd.getFloat() - 0.5f);
			vertex[1] = 2.0f * (rnd.getFloat() - 0.5f);
			DE_STATIC_ASSERT(NUM_COMPONENTS == 4);
			vertex[2] = 0.0f;
			vertex[3] = 1.0f;
		}
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(data), data, usage);
	}
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
	GLU_CHECK_ERROR(gl.getError());
}